

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesStandbyGetMode(zes_standby_handle_t hStandby,zes_standby_promo_mode_t *pMode)

{
  zes_pfnStandbyGetMode_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnStandbyGetMode_t pfnGetMode;
  zes_standby_promo_mode_t *pMode_local;
  zes_standby_handle_t hStandby_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Standby).pfnGetMode;
    if (p_Var1 == (zes_pfnStandbyGetMode_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hStandby_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hStandby_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hStandby_local._4_4_ = (*p_Var1)(hStandby,pMode);
    }
  }
  else {
    hStandby_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hStandby_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesStandbyGetMode(
    zes_standby_handle_t hStandby,                  ///< [in] Handle for the component.
    zes_standby_promo_mode_t* pMode                 ///< [in,out] Will contain the current standby mode.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnStandbyGetMode_t pfnGetMode = [&result] {
        auto pfnGetMode = ze_lib::context->zesDdiTable.load()->Standby.pfnGetMode;
        if( nullptr == pfnGetMode ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetMode;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetMode( hStandby, pMode );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetMode = ze_lib::context->zesDdiTable.load()->Standby.pfnGetMode;
    if( nullptr == pfnGetMode ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetMode( hStandby, pMode );
    #endif
}